

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_mtree_free(archive_write *a)

{
  attr_counter *__ptr;
  mtree_writer *in_RDI;
  mtree_writer *mtree;
  
  __ptr = (in_RDI->acs).flags_list;
  if (__ptr != (attr_counter *)0x0) {
    mtree_entry_register_free(in_RDI);
    archive_string_free((archive_string *)0x182da0);
    archive_string_free((archive_string *)0x182dad);
    archive_string_free((archive_string *)0x182dba);
    attr_counter_set_free(in_RDI);
    free(__ptr);
    (in_RDI->acs).flags_list = (attr_counter *)0x0;
  }
  return 0;
}

Assistant:

static int
archive_write_mtree_free(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;

	if (mtree == NULL)
		return (ARCHIVE_OK);

	/* Make sure we dot not leave any entries. */
	mtree_entry_register_free(mtree);
	archive_string_free(&mtree->cur_dirstr);
	archive_string_free(&mtree->ebuf);
	archive_string_free(&mtree->buf);
	attr_counter_set_free(mtree);
	free(mtree);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}